

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

AncillaryMessage * __thiscall
kj::Vector<kj::AncillaryMessage>::add<kj::AncillaryMessage>
          (Vector<kj::AncillaryMessage> *this,AncillaryMessage *params)

{
  AncillaryMessage *pAVar1;
  uchar *puVar2;
  int iVar3;
  RemoveConst<kj::AncillaryMessage> *pRVar4;
  
  pRVar4 = (this->builder).pos;
  if (pRVar4 == (this->builder).endPtr) {
    grow(this,0);
    pRVar4 = (this->builder).pos;
  }
  (pRVar4->data).size_ = (params->data).size_;
  iVar3 = params->type;
  puVar2 = (params->data).ptr;
  pRVar4->level = params->level;
  pRVar4->type = iVar3;
  (pRVar4->data).ptr = puVar2;
  pAVar1 = (this->builder).pos;
  (this->builder).pos = pAVar1 + 1;
  return pAVar1;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }